

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicArray.hpp
# Opt level: O1

void __thiscall
stick::DynamicArray<stick::String>::reserve(DynamicArray<stick::String> *this,Size _s)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  Size SVar4;
  long lVar5;
  Size extraout_RDX;
  long *plVar6;
  ulong uVar7;
  long local_48;
  long local_40;
  Size local_38;
  void *pvVar3;
  
  if ((this->m_data).size >> 5 < _s) {
    pAVar1 = this->m_allocator;
    if (pAVar1 == (Allocator *)0x0) {
      __assert_fail("m_allocator",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x87,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    iVar2 = (*pAVar1->_vptr_Allocator[2])(pAVar1,_s << 5,8);
    pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("blk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x89,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    plVar6 = (long *)(this->m_data).ptr;
    SVar4 = this->m_count;
    if (SVar4 != 0) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)pvVar3 + lVar5) = *(undefined8 *)((long)plVar6 + lVar5);
        *(undefined8 *)((long)pvVar3 + lVar5 + 8) = *(undefined8 *)((long)plVar6 + lVar5 + 8);
        *(undefined8 *)((long)pvVar3 + lVar5 + 0x10) = *(undefined8 *)((long)plVar6 + lVar5 + 0x10);
        *(undefined8 *)((long)pvVar3 + lVar5 + 0x18) = *(undefined8 *)((long)plVar6 + lVar5 + 0x18);
        *(undefined8 *)((long)plVar6 + lVar5) = 0;
        lVar5 = lVar5 + 0x20;
        SVar4 = SVar4 - 1;
      } while (SVar4 != 0);
    }
    local_38 = extraout_RDX;
    if (this->m_count != 0) {
      uVar7 = 0;
      do {
        if (*plVar6 != 0) {
          local_40 = plVar6[2] + 1;
          local_48 = *plVar6;
          (**(code **)(*(long *)plVar6[3] + 0x18))((long *)plVar6[3],&local_48);
          *plVar6 = 0;
          plVar6[1] = 0;
          plVar6[2] = 0;
        }
        uVar7 = uVar7 + 1;
        plVar6 = plVar6 + 4;
      } while (uVar7 < this->m_count);
    }
    if ((this->m_data).ptr != (void *)0x0) {
      (*this->m_allocator->_vptr_Allocator[3])(this->m_allocator,this);
    }
    (this->m_data).ptr = pvVar3;
    (this->m_data).size = local_38;
  }
  return;
}

Assistant:

inline void reserve(Size _s)
    {
        auto c = capacity();
        if (_s > c)
        {
            STICK_ASSERT(m_allocator);
            auto blk = m_allocator->allocate(_s * sizeof(T), alignof(T));
            STICK_ASSERT(blk);
            T * arrayPtr = reinterpret_cast<T *>(blk.ptr);
            T * sourcePtr = reinterpret_cast<T *>(m_data.ptr);

            // move the existing elements over
            for (Size i = 0; i < m_count; ++i)
            {
                new (arrayPtr + i) T(std::move(sourcePtr[i]));
            }

            // call the destructors on the old elements
            for (Size i = 0; i < m_count; ++i)
            {
                sourcePtr[i].~T();
            }

            if (m_data)
                m_allocator->deallocate(m_data);

            m_data = blk;
        }
    }